

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginGroup(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiGroupData *__src;
  ImGuiContext *pIVar3;
  ImGuiGroupData *__dest;
  int iVar4;
  int iVar5;
  float fVar6;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  iVar1 = (GImGui->GroupStack).Size;
  iVar5 = iVar1 + 1;
  iVar4 = (GImGui->GroupStack).Capacity;
  if (iVar1 < iVar4) {
    __dest = (GImGui->GroupStack).Data;
  }
  else {
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar4 <= iVar5) {
      iVar4 = iVar5;
    }
    __dest = (ImGuiGroupData *)MemAlloc((long)iVar4 * 0x38);
    __src = (pIVar3->GroupStack).Data;
    if (__src != (ImGuiGroupData *)0x0) {
      memcpy(__dest,__src,(long)(pIVar3->GroupStack).Size * 0x38);
      MemFree((pIVar3->GroupStack).Data);
    }
    (pIVar3->GroupStack).Data = __dest;
    (pIVar3->GroupStack).Capacity = iVar4;
  }
  (pIVar3->GroupStack).Size = iVar5;
  __dest[iVar1].WindowID = pIVar2->ID;
  __dest[iVar1].BackupCursorPos = (pIVar2->DC).CursorPos;
  __dest[iVar1].BackupCursorPosPrevLine = (pIVar2->DC).CursorPosPrevLine;
  __dest[iVar1].BackupCursorMaxPos = (pIVar2->DC).CursorMaxPos;
  __dest[iVar1].BackupIndent.x = (pIVar2->DC).Indent.x;
  __dest[iVar1].BackupGroupOffset.x = (pIVar2->DC).GroupOffset.x;
  __dest[iVar1].BackupCurrLineSize = (pIVar2->DC).CurrLineSize;
  __dest[iVar1].BackupCurrLineTextBaseOffset = (pIVar2->DC).CurrLineTextBaseOffset;
  __dest[iVar1].BackupActiveIdIsAlive = pIVar3->ActiveIdIsAlive;
  __dest[iVar1].BackupHoveredIdIsAlive = pIVar3->HoveredId != 0;
  __dest[iVar1].BackupIsSameLine = (pIVar2->DC).IsSameLine;
  __dest[iVar1].BackupActiveIdPreviousFrameIsAlive = pIVar3->ActiveIdPreviousFrameIsAlive;
  __dest[iVar1].EmitItem = true;
  fVar6 = ((pIVar2->DC).CursorPos.x - (pIVar2->Pos).x) - (pIVar2->DC).ColumnsOffset.x;
  (pIVar2->DC).GroupOffset.x = fVar6;
  (pIVar2->DC).Indent.x = fVar6;
  (pIVar2->DC).CursorMaxPos = (pIVar2->DC).CursorPos;
  (pIVar2->DC).CurrLineSize.x = 0.0;
  (pIVar2->DC).CurrLineSize.y = 0.0;
  if (pIVar3->LogEnabled == true) {
    pIVar3->LogLinePosY = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupIsSameLine = window->DC.IsSameLine;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}